

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int test(void)

{
  char cVar1;
  char extraout_AL;
  char extraout_AL_00;
  int iVar2;
  NoCopy *pNVar3;
  char *__s1;
  char *pcVar4;
  int iVar5;
  My MVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  uint uVar7;
  int iVar8;
  _Any_data *p_Var9;
  _Any_data *this;
  int in_R8D;
  float fVar10;
  mock<My,_MyMock> mock;
  raii_mock<const_char_*(int,_char)> _mockaron_function_mock74;
  My real;
  raii_mock<float_(float)> _mockaron_function_mock85;
  My local_b8;
  undefined1 local_b0 [16];
  raii_mock<float_(float)> local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  My::My((My *)(local_b0 + 8),3.14);
  iVar2 = My::f((My *)(local_b0 + 8),4);
  if (iVar2 != 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: real.f(4) == 16",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  uVar7 = (uint)(iVar2 != 0x10);
  mockaron::mock<My,_MyMock>::mock((mock<My,_MyMock> *)&local_b8);
  iVar2 = My::f(&local_b8,4);
  if (iVar2 != 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: mock.get().f(4) == 8",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  local_b0._0_4_ = 4;
  iVar2 = My::g(&local_b8,(int *)local_b0);
  if (iVar2 != 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: mock.get().g(4) == 8",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  fVar10 = My::g(&local_b8,2.0);
  if ((fVar10 != 4.0) || (NAN(fVar10))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: mock.get().g(2.0f) == 4.0f",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  iVar2 = My::h(&local_b8,2);
  if (iVar2 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: mock.get().h(2) == 4",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  iVar2 = My::i(&local_b8);
  if (iVar2 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: mock.get().i() == 2",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  My::j(&local_b8);
  pNVar3 = My::k(&local_b8);
  MVar6 = local_b8;
  if (pNVar3 != (NoCopy *)((long)local_b8 + 0x44)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: &mock.get().k() == &mock.get_mock_impl().no",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
    MVar6 = local_b8;
  }
  if (*(int *)((long)MVar6 + 0x40) != 0x2a) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: mock.get_mock_impl().z == 42",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  iVar5 = MVar6._i;
  iVar2 = My::f((My *)(local_b0 + 8),4);
  if (iVar2 != 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: real.f(4) == 16",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  __s1 = My::l(8,'\0');
  iVar8 = 0x106116;
  iVar2 = strcmp(__s1,"fortytwo");
  pcVar4 = extraout_RDX;
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: !std::strcmp(My::l(8, 0), \"fortytwo\")",0x33);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    iVar8 = (int)cVar1;
    __s1 = (char *)std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
    pcVar4 = extraout_RDX_00;
  }
  My::m(__s1,iVar8,pcVar4,iVar5,in_R8D);
  if (extraout_AL != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: !My::m()",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  iVar2 = My::n(2);
  if (iVar2 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: My::n(2) == 4",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  fVar10 = My::n(2.0);
  if ((fVar10 != 4.0) || (NAN(fVar10))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: My::n(2.f) == 4.f",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<const_char_*(int,_char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:70:5)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<const_char_*(int,_char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:70:5)>
             ::_M_manager;
  mockaron::detail::raii_mock<const_char_*(int,_char)>::raii_mock
            ((raii_mock<const_char_*(int,_char)> *)local_b0,My::l,
             (function<const_char_*(int,_char)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  pcVar4 = My::l(8,'\0');
  iVar2 = strcmp(pcVar4,"roflol");
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: !std::strcmp(My::l(8, 0), \"roflol\")",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  mockaron::detail::unregister_function_mock((void *)0x1030ae);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:78:5)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:78:5)>
             ::_M_manager;
  iVar2 = 0x104bb8;
  this = (_Any_data *)local_b0;
  mockaron::detail::raii_mock<bool_()>::raii_mock
            ((raii_mock<bool_()> *)this,My::m,(function<bool_()> *)&local_58);
  pcVar4 = extraout_RDX_01;
  if (local_48 != (code *)0x0) {
    p_Var9 = &local_58;
    this = p_Var9;
    (*local_48)(p_Var9,p_Var9,__destroy_functor);
    iVar2 = (int)p_Var9;
    pcVar4 = extraout_RDX_02;
  }
  My::m(this,iVar2,pcVar4,iVar5,in_R8D);
  if (extraout_AL_00 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: My::m()",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  mockaron::detail::unregister_function_mock((void *)0x103154);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:82:5)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:82:5)>
             ::_M_manager;
  mockaron::detail::raii_mock<int_(int)>::raii_mock
            ((raii_mock<int_(int)> *)local_b0,My::n,(function<int_(int)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:84:5)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:84:5)>
             ::_M_manager;
  mockaron::detail::raii_mock<float_(float)>::raii_mock
            (&local_a0,My::n,(function<float_(float)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  iVar2 = My::n(2);
  if (iVar2 != 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: My::n(2) == 8",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  fVar10 = My::n(2.0);
  if ((fVar10 != 16.0) || (NAN(fVar10))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed: My::n(2.f) == 16.f",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  mockaron::detail::unregister_function_mock((void *)0x1032ab);
  mockaron::detail::unregister_function_mock((void *)0x1032b5);
  mockaron::mock<My,_MyMock>::~mock((mock<My,_MyMock> *)&local_b8);
  My::~My((My *)(local_b0 + 8));
  return uVar7;
}

Assistant:

int test()
{
  int failure = 0;
  My real(3.14);
  CHECK(real.f(4) == 16);

  mockaron::mock<My, MyMock> mock;

  CHECK(mock.get().f(4) == 8);
  CHECK(mock.get().g(4) == 8);
  CHECK(mock.get().g(2.0f) == 4.0f);
  CHECK(mock.get().h(2) == 4);
  CHECK(mock.get().i() == 2);
  mock.get().j();
  CHECK(&mock.get().k() == &mock.get_mock_impl().no);
  CHECK(mock.get_mock_impl().z == 42);

  CHECK(real.f(4) == 16);

  CHECK(!std::strcmp(My::l(8, 0), "fortytwo"));
  CHECK(!My::m());
  CHECK(My::n(2) == 4);
  CHECK(My::n(2.f) == 4.f);

  {
    MOCKARON_SET_FUNCTION_IMPL(My::l, [](int i, char) {
      if (i == 8)
        return "roflol";
      return (char const*)nullptr;
    });
    CHECK(!std::strcmp(My::l(8, 0), "roflol"));
  }
  {
    MOCKARON_SET_FUNCTION_IMPL(My::m, []() { return true; });
    CHECK(My::m());
  }
  {
    MOCKARON_SET_FUNCTION_IMPL(static_cast<int (*)(int)>(My::n),
                               [](int i) { return i * 4; });
    MOCKARON_SET_FUNCTION_IMPL(static_cast<float (*)(float)>(My::n),
                               [](float i) { return i * 8; });
    CHECK(My::n(2) == 8);
    CHECK(My::n(2.f) == 16.f);
  }

  return failure;
}